

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewScopeLayer.cpp
# Opt level: O0

void __thiscall
NewScopeLayer::NewScopeLayer
          (NewScopeLayer *this,NewScopeLayer *parent,string *name,Symbol *class_symbol,
          Symbol *method_symbol)

{
  Symbol *method_symbol_local;
  Symbol *class_symbol_local;
  string *name_local;
  NewScopeLayer *parent_local;
  NewScopeLayer *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  this->parent_ = parent;
  std::vector<NewScopeLayer_*,_std::allocator<NewScopeLayer_*>_>::vector(&this->children_);
  Symbol::Symbol(&this->class_symbol_,class_symbol);
  Symbol::Symbol(&this->method_symbol_,method_symbol);
  this->traverse_index = 0;
  std::
  unordered_map<Symbol,_std::shared_ptr<PrimitiveObject>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>_>_>
  ::unordered_map(&this->variables_);
  std::
  unordered_map<Symbol,_std::shared_ptr<PrimitiveObject>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>_>_>
  ::unordered_map(&this->arrays_);
  std::
  unordered_map<Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map(&this->user_type_system_);
  std::
  unordered_map<Symbol,_int,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_int>_>_>
  ::unordered_map(&this->symbol_types_);
  AddChild(this->parent_,this);
  return;
}

Assistant:

NewScopeLayer::NewScopeLayer(NewScopeLayer* parent, std::string name,
                             const Symbol& class_symbol,
                             const Symbol& method_symbol)
    : parent_(parent),
      name_(std::move(name)),
      class_symbol_(class_symbol),
      method_symbol_(method_symbol),
      traverse_index(0) {
  parent_->AddChild(this);
}